

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O3

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ssh_hash *psVar6;
  char *pcVar7;
  FILE *__stream;
  char *__filename;
  FILE *__stream_00;
  size_t __n;
  size_t sVar8;
  int *piVar9;
  ulong uVar10;
  bool bVar11;
  char **ppcVar12;
  char *pcVar13;
  long lVar14;
  size_t i;
  test *ptVar15;
  long lVar16;
  size_t i_1;
  uint8_t tests_to_run [91];
  char bufn [4096];
  char buf1 [4096];
  long local_20c8;
  long local_20b0;
  undefined8 local_20a0;
  char local_2098 [96];
  undefined1 local_2038 [4096];
  undefined1 local_1038 [4104];
  
  pcVar7 = *argv;
  builtin_strncpy(local_2098 + 0x50,"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0xb);
  builtin_strncpy(local_2098 + 0x40,
                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
  builtin_strncpy(local_2098 + 0x30,
                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
  builtin_strncpy(local_2098 + 0x20,
                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
  builtin_strncpy(local_2098 + 0x10,
                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
  builtin_strncpy(local_2098,"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10
                 );
  psVar6 = sha256_select(&ssh_sha256);
  if (psVar6 != (ssh_hash *)0x0) {
    (*psVar6->vt->reset)(psVar6);
  }
  random_hash = psVar6;
  if (argc < 2) {
    bVar3 = false;
  }
  else {
    bVar1 = 1;
    bVar3 = false;
    bVar11 = false;
    do {
      iVar5 = argc + -1;
      pcVar13 = argv[1];
      ppcVar12 = argv + 1;
      if ((bool)(*pcVar13 == '-' & bVar1)) {
        if ((pcVar13[1] == 'O') && (pcVar13[2] == '\0')) {
          if (argc == 2) {
            main_cold_2();
            return 1;
          }
          outdir = argv[2];
          ppcVar12 = argv + 2;
          bVar1 = 1;
          argc = argc + -2;
        }
        else if (((pcVar13[1] == 'k') && (pcVar13[2] == '\0')) ||
                (iVar4 = strcmp(pcVar13,"--keep"), iVar4 == 0)) {
          bVar3 = true;
          bVar1 = 1;
          argc = iVar5;
        }
        else {
          if ((pcVar13[1] != '-') || (pcVar13[2] != '\0')) {
            iVar5 = strcmp(pcVar13,"--help");
            if (iVar5 == 0) {
              printf("  usage: drrun -c test/sclog/libsclog.so -- %s -O <outdir>\n",pcVar7);
              puts("options: -O <outdir>           put log files in the specified directory");
              puts("         -k, --keep            do not delete log files for tests that passed");
              puts("   also: --help                display this text");
              return 0;
            }
            pcVar7 = "unknown command line option \'%s\'\n";
LAB_00106c59:
            fprintf(_stderr,pcVar7,pcVar13);
            return 1;
          }
          bVar1 = 0;
          argc = iVar5;
        }
      }
      else {
        if (!bVar11) {
          local_2098[0x50] = '\0';
          local_2098[0x51] = '\0';
          local_2098[0x52] = '\0';
          local_2098[0x53] = '\0';
          local_2098[0x54] = '\0';
          local_2098[0x55] = '\0';
          local_2098[0x56] = '\0';
          local_2098[0x57] = '\0';
          local_2098[0x58] = '\0';
          local_2098[0x59] = '\0';
          local_2098[0x5a] = '\0';
          local_2098[0x40] = '\0';
          local_2098[0x41] = '\0';
          local_2098[0x42] = '\0';
          local_2098[0x43] = '\0';
          local_2098[0x44] = '\0';
          local_2098[0x45] = '\0';
          local_2098[0x46] = '\0';
          local_2098[0x47] = '\0';
          local_2098[0x48] = '\0';
          local_2098[0x49] = '\0';
          local_2098[0x4a] = '\0';
          local_2098[0x4b] = '\0';
          local_2098[0x4c] = '\0';
          local_2098[0x4d] = '\0';
          local_2098[0x4e] = '\0';
          local_2098[0x4f] = '\0';
          local_2098[0x30] = '\0';
          local_2098[0x31] = '\0';
          local_2098[0x32] = '\0';
          local_2098[0x33] = '\0';
          local_2098[0x34] = '\0';
          local_2098[0x35] = '\0';
          local_2098[0x36] = '\0';
          local_2098[0x37] = '\0';
          local_2098[0x38] = '\0';
          local_2098[0x39] = '\0';
          local_2098[0x3a] = '\0';
          local_2098[0x3b] = '\0';
          local_2098[0x3c] = '\0';
          local_2098[0x3d] = '\0';
          local_2098[0x3e] = '\0';
          local_2098[0x3f] = '\0';
          local_2098[0x20] = '\0';
          local_2098[0x21] = '\0';
          local_2098[0x22] = '\0';
          local_2098[0x23] = '\0';
          local_2098[0x24] = '\0';
          local_2098[0x25] = '\0';
          local_2098[0x26] = '\0';
          local_2098[0x27] = '\0';
          local_2098[0x28] = '\0';
          local_2098[0x29] = '\0';
          local_2098[0x2a] = '\0';
          local_2098[0x2b] = '\0';
          local_2098[0x2c] = '\0';
          local_2098[0x2d] = '\0';
          local_2098[0x2e] = '\0';
          local_2098[0x2f] = '\0';
          local_2098[0x10] = '\0';
          local_2098[0x11] = '\0';
          local_2098[0x12] = '\0';
          local_2098[0x13] = '\0';
          local_2098[0x14] = '\0';
          local_2098[0x15] = '\0';
          local_2098[0x16] = '\0';
          local_2098[0x17] = '\0';
          local_2098[0x18] = '\0';
          local_2098[0x19] = '\0';
          local_2098[0x1a] = '\0';
          local_2098[0x1b] = '\0';
          local_2098[0x1c] = '\0';
          local_2098[0x1d] = '\0';
          local_2098[0x1e] = '\0';
          local_2098[0x1f] = '\0';
          local_2098[0] = '\0';
          local_2098[1] = '\0';
          local_2098[2] = '\0';
          local_2098[3] = '\0';
          local_2098[4] = '\0';
          local_2098[5] = '\0';
          local_2098[6] = '\0';
          local_2098[7] = '\0';
          local_2098[8] = '\0';
          local_2098[9] = '\0';
          local_2098[10] = '\0';
          local_2098[0xb] = '\0';
          local_2098[0xc] = '\0';
          local_2098[0xd] = '\0';
          local_2098[0xe] = '\0';
          local_2098[0xf] = '\0';
        }
        bVar2 = false;
        lVar16 = 0;
        do {
          lVar14 = lVar16 + 1;
          ptVar15 = tests + lVar16;
          while (iVar4 = wc_match(pcVar13,ptVar15->testname), iVar4 == 0) {
            lVar14 = lVar14 + 1;
            ptVar15 = ptVar15 + 1;
            if (lVar14 == 0x5c) {
              argc = iVar5;
              bVar11 = true;
              if (bVar2) goto LAB_001067c3;
              pcVar7 = "no test name matched \'%s\'\n";
              goto LAB_00106c59;
            }
          }
          *(undefined1 *)((long)&local_20a0 + lVar14 + 7) = 1;
          bVar2 = true;
          lVar16 = lVar14;
          argc = iVar5;
          bVar11 = bVar2;
        } while (lVar14 != 0x5b);
      }
LAB_001067c3:
      argv = ppcVar12;
    } while (1 < argc);
  }
  local_20a0 = (*dry_run)();
  if (local_20a0 == 0) {
    printf("Live run, main = %p\n",main);
    if (outdir == (char *)0x0) {
      main_cold_1();
      return 1;
    }
    printf("Will write log files to %s\n");
  }
  else {
    puts("Dry run (DynamoRIO instrumentation not detected)");
  }
  lVar16 = 0;
  local_20b0 = 0;
  local_20c8 = 0;
  do {
    if (local_2098[lVar16] != '\0') {
      pcVar7 = tests[lVar16].testname;
      printf("Running test %s ... ",pcVar7);
      fflush(_stdout);
      test_skipped = '\0';
      random_counter = 0;
      random_buf_limit = 0;
      test_index = 0;
      random_seedstr = pcVar7;
      test_basename = pcVar7;
      (*tests[lVar16].testfn)();
      if (test_skipped == '\x01') {
        puts("skipped");
      }
      else {
        local_20c8 = local_20c8 + 1;
        if (local_20a0 == 0) {
          if (test_index < 2) {
            puts("FAIL: test did not generate multiple output files");
          }
          else {
            pcVar7 = dupprintf("%s/%s.%04zu",outdir,test_basename,0);
            __stream = fopen(pcVar7,"rb");
            if (__stream == (FILE *)0x0) {
              piVar9 = __errno_location();
              pcVar13 = strerror(*piVar9);
LAB_00106b1b:
              printf("ERR: %s: open: %s\n",pcVar7,pcVar13);
            }
            else {
              if (1 < test_index) {
                uVar10 = 1;
                do {
                  __filename = dupprintf("%s/%s.%04zu",outdir,test_basename);
                  __stream_00 = fopen(__filename,"rb");
                  if (__stream_00 == (FILE *)0x0) {
                    piVar9 = __errno_location();
                    pcVar13 = strerror(*piVar9);
                    pcVar7 = __filename;
                    goto LAB_00106b1b;
                  }
                  rewind(__stream);
                  while( true ) {
                    __n = fread(local_1038,1,0x1000,__stream);
                    sVar8 = fread(local_2038,1,0x1000,__stream_00);
                    if (__n != sVar8) {
                      pcVar13 = "FAIL: %s %s: different lengths\n";
                      goto LAB_00106b44;
                    }
                    if (__n == 0) break;
                    iVar5 = bcmp(local_1038,local_2038,__n);
                    if (iVar5 != 0) {
                      pcVar13 = "FAIL: %s %s: different content\n";
                      goto LAB_00106b44;
                    }
                  }
                  iVar5 = feof(__stream);
                  if (iVar5 == 0) {
                    pcVar13 = "FAIL: %s %s: error at end of file\n";
LAB_00106b44:
                    printf(pcVar13,pcVar7,__filename);
                    fclose(__stream_00);
                    safefree(__filename);
                    goto LAB_0010690b;
                  }
                  iVar5 = feof(__stream_00);
                  if (iVar5 == 0) {
                    pcVar13 = "FAIL: %s %s: error at end of file\n";
                    goto LAB_00106b44;
                  }
                  fclose(__stream_00);
                  safefree(__filename);
                  uVar10 = uVar10 + 1;
                } while (uVar10 < test_index);
              }
              fclose(__stream);
              safefree(pcVar7);
              puts("pass");
              local_20b0 = local_20b0 + 1;
              if (test_index != 0 && !bVar3) {
                uVar10 = 0;
                do {
                  pcVar7 = dupprintf("%s/%s.%04zu",outdir,test_basename,uVar10);
                  remove(pcVar7);
                  safefree(pcVar7);
                  uVar10 = uVar10 + 1;
                } while (uVar10 < test_index);
              }
            }
          }
        }
        else {
          puts("dry run done");
        }
      }
    }
LAB_0010690b:
    lVar16 = lVar16 + 1;
    if (lVar16 == 0x5b) {
      (*random_hash->vt->free)(random_hash);
      if (local_20c8 != local_20b0) {
        printf("%zu tests failed\n");
        return 1;
      }
      puts("All tests passed");
      return 0;
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
    bool doing_opts = true;
    const char *pname = argv[0];
    uint8_t tests_to_run[lenof(tests)];
    bool keep_outfiles = false;
    bool test_names_given = false;

    memset(tests_to_run, 1, sizeof(tests_to_run));
    random_hash = ssh_hash_new(&ssh_sha256);

    while (--argc > 0) {
        char *p = *++argv;

        if (p[0] == '-' && doing_opts) {
            if (!strcmp(p, "-O")) {
                if (--argc <= 0) {
                    fprintf(stderr, "'-O' expects a directory name\n");
                    return 1;
                }
                outdir = *++argv;
            } else if (!strcmp(p, "-k") || !strcmp(p, "--keep")) {
                keep_outfiles = true;
            } else if (!strcmp(p, "--")) {
                doing_opts = false;
            } else if (!strcmp(p, "--help")) {
                printf("  usage: drrun -c test/sclog/libsclog.so -- "
                       "%s -O <outdir>\n", pname);
                printf("options: -O <outdir>           "
                       "put log files in the specified directory\n");
                printf("         -k, --keep            "
                       "do not delete log files for tests that passed\n");
                printf("   also: --help                "
                       "display this text\n");
                return 0;
            } else {
                fprintf(stderr, "unknown command line option '%s'\n", p);
                return 1;
            }
        } else {
            if (!test_names_given) {
                test_names_given = true;
                memset(tests_to_run, 0, sizeof(tests_to_run));
            }
            bool found_one = false;
            for (size_t i = 0; i < lenof(tests); i++) {
                if (wc_match(p, tests[i].testname)) {
                    tests_to_run[i] = 1;
                    found_one = true;
                }
            }
            if (!found_one) {
                fprintf(stderr, "no test name matched '%s'\n", p);
                return 1;
            }
        }
    }

    bool is_dry_run = dry_run();

    if (is_dry_run) {
        printf("Dry run (DynamoRIO instrumentation not detected)\n");
    } else {
        /* Print the address of main() in this run. The idea is that
         * if this image is compiled to be position-independent, then
         * PC values in the logs won't match the ones you get if you
         * disassemble the binary, so it'll be harder to match up the
         * log messages to the code. But if you know the address of a
         * fixed (and not inlined) function in both worlds, you can
         * find out the offset between them. */
        printf("Live run, main = %p\n", (void *)main);

        if (!outdir) {
            fprintf(stderr, "expected -O <outdir> option\n");
            return 1;
        }
        printf("Will write log files to %s\n", outdir);
    }

    size_t nrun = 0, npass = 0;

    for (size_t i = 0; i < lenof(tests); i++) {
        bool keep_these_outfiles = true;

        if (!tests_to_run[i])
            continue;
        const struct test *test = &tests[i];
        printf("Running test %s ... ", test->testname);
        fflush(stdout);

        test_skipped = false;
        random_seed(test->testname);
        test_basename = test->testname;
        test_index = 0;

        test->testfn();

        if (test_skipped) {
            /* Used for e.g. tests of hardware-accelerated crypto when
             * the hardware acceleration isn't available */
            printf("skipped\n");
            continue;
        }

        nrun++;

        if (is_dry_run) {
            printf("dry run done\n");
            continue;                  /* test files won't exist anyway */
        }

        if (test_index < 2) {
            printf("FAIL: test did not generate multiple output files\n");
            goto test_done;
        }

        char *firstfile = log_filename(test_basename, 0);
        FILE *firstfp = fopen(firstfile, "rb");
        if (!firstfp) {
            printf("ERR: %s: open: %s\n", firstfile, strerror(errno));
            goto test_done;
        }
        for (size_t i = 1; i < test_index; i++) {
            char *nextfile = log_filename(test_basename, i);
            FILE *nextfp = fopen(nextfile, "rb");
            if (!nextfp) {
                printf("ERR: %s: open: %s\n", nextfile, strerror(errno));
                goto test_done;
            }

            rewind(firstfp);
            char buf1[4096], bufn[4096];
            bool compare_ok = false;
            while (true) {
                size_t r1 = fread(buf1, 1, sizeof(buf1), firstfp);
                size_t rn = fread(bufn, 1, sizeof(bufn), nextfp);
                if (r1 != rn) {
                    printf("FAIL: %s %s: different lengths\n",
                           firstfile, nextfile);
                    break;
                }
                if (r1 == 0) {
                    if (feof(firstfp) && feof(nextfp)) {
                        compare_ok = true;
                    } else {
                        printf("FAIL: %s %s: error at end of file\n",
                               firstfile, nextfile);
                    }
                    break;
                }
                if (memcmp(buf1, bufn, r1) != 0) {
                    printf("FAIL: %s %s: different content\n",
                           firstfile, nextfile);
                    break;
                }
            }
            fclose(nextfp);
            sfree(nextfile);
            if (!compare_ok) {
                goto test_done;
            }
        }
        fclose(firstfp);
        sfree(firstfile);

        printf("pass\n");
        npass++;
        keep_these_outfiles = keep_outfiles;

      test_done:
        if (!keep_these_outfiles) {
            for (size_t i = 0; i < test_index; i++) {
                char *file = log_filename(test_basename, i);
                remove(file);
                sfree(file);
            }
        }
    }

    ssh_hash_free(random_hash);

    if (npass == nrun) {
        printf("All tests passed\n");
        return 0;
    } else {
        printf("%"SIZEu" tests failed\n", nrun - npass);
        return 1;
    }
}